

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  int iVar2;
  pointer pnVar3;
  pointer pDVar4;
  type_conflict5 tVar5;
  bool bVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  int k;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  pointer pnVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  int k_1;
  long lVar17;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar18;
  long lVar19;
  ulong uVar20;
  int l;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  uint local_81c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slack;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  soplex local_1b0 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  soplex local_b0 [128];
  
  bVar23 = 0;
  if (this->m_j != this->m_old_j) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[this->m_j].m_backend);
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[this->m_j].m_backend);
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  iVar2 = (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  lVar21 = (long)(this->m_old_i - iVar2);
  lVar19 = 0x20;
  lVar10 = lVar21 * 0x80;
  for (lVar17 = 0; lVar17 < iVar2; lVar17 = lVar17 + 1) {
    uVar9 = (((this->m_col).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem)->val).m_backend.data._M_elems[lVar19];
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)((long)pnVar3[1].m_backend.data._M_elems + lVar10),
               &pnVar3[(int)uVar9].m_backend);
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)((long)pnVar3[1].m_backend.data._M_elems + lVar10),
               &pnVar3[(int)uVar9].m_backend);
    rStatus->data[lVar21 + lVar17 + 1] = rStatus->data[(int)uVar9];
    iVar2 = (this->m_col).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    lVar19 = lVar19 + 0x21;
    lVar10 = lVar10 + 0x80;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&slack,iVar2);
  if (this->m_loFree == false) {
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_11.m_backend,-*pdVar7,(type *)0x0);
    local_81c = 0xffffffff;
    pSVar1 = &(this->m_lRhs).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    for (lVar19 = 0;
        lVar19 < (int)((ulong)((long)(this->m_rows).data.
                                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_rows).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar19 = lVar19 + 1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&val.m_backend,0.0,(type *)0x0);
      pDVar4 = (this->m_rows).data.
               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar18 = &pDVar4[lVar19].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      lVar10 = 0;
      for (lVar17 = 0;
          lVar17 < pDVar4[lVar19].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused; lVar17 = lVar17 + 1) {
        pNVar16 = pSVar18->m_elem;
        iVar2 = *(int *)((long)(&pNVar16->val + 1) + lVar10);
        if (iVar2 != this->m_j) {
          scale.m_backend.fpclass = cpp_dec_float_finite;
          scale.m_backend.prec_elem = 0x1c;
          scale.m_backend.data._M_elems[0] = 0;
          scale.m_backend.data._M_elems[1] = 0;
          scale.m_backend.data._M_elems[2] = 0;
          scale.m_backend.data._M_elems[3] = 0;
          scale.m_backend.data._M_elems[4] = 0;
          scale.m_backend.data._M_elems[5] = 0;
          scale.m_backend.data._M_elems[6] = 0;
          scale.m_backend.data._M_elems[7] = 0;
          scale.m_backend.data._M_elems[8] = 0;
          scale.m_backend.data._M_elems[9] = 0;
          scale.m_backend.data._M_elems[10] = 0;
          scale.m_backend.data._M_elems[0xb] = 0;
          scale.m_backend.data._M_elems[0xc] = 0;
          scale.m_backend.data._M_elems[0xd] = 0;
          scale.m_backend.data._M_elems[0xe] = 0;
          scale.m_backend.data._M_elems[0xf] = 0;
          scale.m_backend.data._M_elems[0x10] = 0;
          scale.m_backend.data._M_elems[0x11] = 0;
          scale.m_backend.data._M_elems[0x12] = 0;
          scale.m_backend.data._M_elems[0x13] = 0;
          scale.m_backend.data._M_elems[0x14] = 0;
          scale.m_backend.data._M_elems[0x15] = 0;
          scale.m_backend.data._M_elems[0x16] = 0;
          scale.m_backend.data._M_elems[0x17] = 0;
          scale.m_backend.data._M_elems[0x18] = 0;
          scale.m_backend.data._M_elems[0x19] = 0;
          scale.m_backend.data._M_elems._104_5_ = 0;
          scale.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          scale.m_backend.exp = 0;
          scale.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&scale.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(pNVar16->val).m_backend.data._M_elems + lVar10),
                     &(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&val.m_backend,&scale.m_backend);
        }
        lVar10 = lVar10 + 0x84;
      }
      uVar9 = (uint)lVar19;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_1b0,pSVar1,uVar9);
      pnVar12 = &val;
      pnVar13 = &local_3b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = val.m_backend.exp;
      local_3b0.m_backend.neg = val.m_backend.neg;
      local_3b0.m_backend.fpclass = val.m_backend.fpclass;
      local_3b0.m_backend.prec_elem = val.m_backend.prec_elem;
      maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&scale.m_backend,local_1b0,&local_3b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)0x0);
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0x3ff00000;
      tVar5 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&scale.m_backend,(double *)&z);
      if (tVar5) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&scale.m_backend,1.0);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_3.m_backend,pSVar1,uVar9);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 0x1c;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems[6] = 0;
      up.m_backend.data._M_elems[7] = 0;
      up.m_backend.data._M_elems[8] = 0;
      up.m_backend.data._M_elems[9] = 0;
      up.m_backend.data._M_elems[10] = 0;
      up.m_backend.data._M_elems[0xb] = 0;
      up.m_backend.data._M_elems[0xc] = 0;
      up.m_backend.data._M_elems[0xd] = 0;
      up.m_backend.data._M_elems[0xe] = 0;
      up.m_backend.data._M_elems[0xf] = 0;
      up.m_backend.data._M_elems[0x10] = 0;
      up.m_backend.data._M_elems[0x11] = 0;
      up.m_backend.data._M_elems[0x12] = 0;
      up.m_backend.data._M_elems[0x13] = 0;
      up.m_backend.data._M_elems[0x14] = 0;
      up.m_backend.data._M_elems[0x15] = 0;
      up.m_backend.data._M_elems[0x16] = 0;
      up.m_backend.data._M_elems[0x17] = 0;
      up.m_backend.data._M_elems[0x18] = 0;
      up.m_backend.data._M_elems[0x19] = 0;
      up.m_backend.data._M_elems._104_5_ = 0;
      up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&up.m_backend,&result_3.m_backend,&scale.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&val.m_backend,&scale.m_backend);
      z.m_backend.fpclass = cpp_dec_float_finite;
      z.m_backend.prec_elem = 0x1c;
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0;
      z.m_backend.data._M_elems[2] = 0;
      z.m_backend.data._M_elems[3] = 0;
      z.m_backend.data._M_elems[4] = 0;
      z.m_backend.data._M_elems[5] = 0;
      z.m_backend.data._M_elems[6] = 0;
      z.m_backend.data._M_elems[7] = 0;
      z.m_backend.data._M_elems[8] = 0;
      z.m_backend.data._M_elems[9] = 0;
      z.m_backend.data._M_elems[10] = 0;
      z.m_backend.data._M_elems[0xb] = 0;
      z.m_backend.data._M_elems[0xc] = 0;
      z.m_backend.data._M_elems[0xd] = 0;
      z.m_backend.data._M_elems[0xe] = 0;
      z.m_backend.data._M_elems[0xf] = 0;
      z.m_backend.data._M_elems[0x10] = 0;
      z.m_backend.data._M_elems[0x11] = 0;
      z.m_backend.data._M_elems[0x12] = 0;
      z.m_backend.data._M_elems[0x13] = 0;
      z.m_backend.data._M_elems[0x14] = 0;
      z.m_backend.data._M_elems[0x15] = 0;
      z.m_backend.data._M_elems[0x16] = 0;
      z.m_backend.data._M_elems[0x17] = 0;
      z.m_backend.data._M_elems[0x18] = 0;
      z.m_backend.data._M_elems[0x19] = 0;
      z.m_backend.data._M_elems._104_5_ = 0;
      z.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      z.m_backend.exp = 0;
      z.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&z.m_backend,&up.m_backend,&result_1.m_backend);
      pcVar11 = &z.m_backend;
      pnVar12 = &local_430;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar23 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_430.m_backend.exp = z.m_backend.exp;
      local_430.m_backend.neg = z.m_backend.neg;
      local_430.m_backend.fpclass = z.m_backend.fpclass;
      local_430.m_backend.prec_elem = z.m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_230,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_430,&local_230);
      if (bVar6) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&z,0.0);
      }
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 0x1c;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems[6] = 0;
      result_3.m_backend.data._M_elems[7] = 0;
      result_3.m_backend.data._M_elems[8] = 0;
      result_3.m_backend.data._M_elems[9] = 0;
      result_3.m_backend.data._M_elems[10] = 0;
      result_3.m_backend.data._M_elems[0xb] = 0;
      result_3.m_backend.data._M_elems[0xc] = 0;
      result_3.m_backend.data._M_elems[0xd] = 0;
      result_3.m_backend.data._M_elems[0xe] = 0;
      result_3.m_backend.data._M_elems[0xf] = 0;
      result_3.m_backend.data._M_elems[0x10] = 0;
      result_3.m_backend.data._M_elems[0x11] = 0;
      result_3.m_backend.data._M_elems[0x12] = 0;
      result_3.m_backend.data._M_elems[0x13] = 0;
      result_3.m_backend.data._M_elems[0x14] = 0;
      result_3.m_backend.data._M_elems[0x15] = 0;
      result_3.m_backend.data._M_elems[0x16] = 0;
      result_3.m_backend.data._M_elems[0x17] = 0;
      result_3.m_backend.data._M_elems[0x18] = 0;
      result_3.m_backend.data._M_elems[0x19] = 0;
      result_3.m_backend.data._M_elems._104_5_ = 0;
      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_3.m_backend.exp = 0;
      result_3.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_3.m_backend,&z.m_backend,&scale.m_backend);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_1.m_backend,pSVar18,this->m_j);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 0x1c;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems[6] = 0;
      up.m_backend.data._M_elems[7] = 0;
      up.m_backend.data._M_elems[8] = 0;
      up.m_backend.data._M_elems[9] = 0;
      up.m_backend.data._M_elems[10] = 0;
      up.m_backend.data._M_elems[0xb] = 0;
      up.m_backend.data._M_elems[0xc] = 0;
      up.m_backend.data._M_elems[0xd] = 0;
      up.m_backend.data._M_elems[0xe] = 0;
      up.m_backend.data._M_elems[0xf] = 0;
      up.m_backend.data._M_elems[0x10] = 0;
      up.m_backend.data._M_elems[0x11] = 0;
      up.m_backend.data._M_elems[0x12] = 0;
      up.m_backend.data._M_elems[0x13] = 0;
      up.m_backend.data._M_elems[0x14] = 0;
      up.m_backend.data._M_elems[0x15] = 0;
      up.m_backend.data._M_elems[0x16] = 0;
      up.m_backend.data._M_elems[0x17] = 0;
      up.m_backend.data._M_elems[0x18] = 0;
      up.m_backend.data._M_elems[0x19] = 0;
      up.m_backend.data._M_elems._104_5_ = 0;
      up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&up.m_backend,&result_3.m_backend,&result_1.m_backend);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&slack,uVar9,&val);
      tVar5 = boost::multiprecision::operator>(&up,&result_11);
      if (tVar5) {
        pnVar12 = &up;
        pnVar13 = &result_11;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        result_11.m_backend.exp = up.m_backend.exp;
        result_11.m_backend.neg = up.m_backend.neg;
        result_11.m_backend.fpclass = up.m_backend.fpclass;
        result_11.m_backend.prec_elem = up.m_backend.prec_elem;
        local_81c = uVar9;
      }
    }
    tVar5 = boost::multiprecision::operator>(&this->m_bnd,&result_11);
  }
  else {
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_11.m_backend,*pdVar7,(type *)0x0);
    pSVar1 = &(this->m_lRhs).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    local_81c = 0xffffffff;
    for (lVar19 = 0;
        lVar19 < (int)((ulong)((long)(this->m_rows).data.
                                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_rows).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar19 = lVar19 + 1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&val.m_backend,0.0,(type *)0x0);
      pDVar4 = (this->m_rows).data.
               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar18 = &pDVar4[lVar19].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      lVar10 = 0;
      for (lVar17 = 0;
          lVar17 < pDVar4[lVar19].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused; lVar17 = lVar17 + 1) {
        pNVar16 = pSVar18->m_elem;
        iVar2 = *(int *)((long)(&pNVar16->val + 1) + lVar10);
        if (iVar2 != this->m_j) {
          scale.m_backend.fpclass = cpp_dec_float_finite;
          scale.m_backend.prec_elem = 0x1c;
          scale.m_backend.data._M_elems[0] = 0;
          scale.m_backend.data._M_elems[1] = 0;
          scale.m_backend.data._M_elems[2] = 0;
          scale.m_backend.data._M_elems[3] = 0;
          scale.m_backend.data._M_elems[4] = 0;
          scale.m_backend.data._M_elems[5] = 0;
          scale.m_backend.data._M_elems[6] = 0;
          scale.m_backend.data._M_elems[7] = 0;
          scale.m_backend.data._M_elems[8] = 0;
          scale.m_backend.data._M_elems[9] = 0;
          scale.m_backend.data._M_elems[10] = 0;
          scale.m_backend.data._M_elems[0xb] = 0;
          scale.m_backend.data._M_elems[0xc] = 0;
          scale.m_backend.data._M_elems[0xd] = 0;
          scale.m_backend.data._M_elems[0xe] = 0;
          scale.m_backend.data._M_elems[0xf] = 0;
          scale.m_backend.data._M_elems[0x10] = 0;
          scale.m_backend.data._M_elems[0x11] = 0;
          scale.m_backend.data._M_elems[0x12] = 0;
          scale.m_backend.data._M_elems[0x13] = 0;
          scale.m_backend.data._M_elems[0x14] = 0;
          scale.m_backend.data._M_elems[0x15] = 0;
          scale.m_backend.data._M_elems[0x16] = 0;
          scale.m_backend.data._M_elems[0x17] = 0;
          scale.m_backend.data._M_elems[0x18] = 0;
          scale.m_backend.data._M_elems[0x19] = 0;
          scale.m_backend.data._M_elems._104_5_ = 0;
          scale.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          scale.m_backend.exp = 0;
          scale.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&scale.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(pNVar16->val).m_backend.data._M_elems + lVar10),
                     &(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&val.m_backend,&scale.m_backend);
        }
        lVar10 = lVar10 + 0x84;
      }
      uVar9 = (uint)lVar19;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0,pSVar1,uVar9);
      pnVar12 = &val;
      pnVar13 = &local_2b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = val.m_backend.exp;
      local_2b0.m_backend.neg = val.m_backend.neg;
      local_2b0.m_backend.fpclass = val.m_backend.fpclass;
      local_2b0.m_backend.prec_elem = val.m_backend.prec_elem;
      maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&scale.m_backend,local_b0,&local_2b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)0x0);
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0x3ff00000;
      tVar5 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&scale.m_backend,(double *)&z);
      if (tVar5) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&scale.m_backend,1.0);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_3.m_backend,pSVar1,uVar9);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 0x1c;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems[6] = 0;
      up.m_backend.data._M_elems[7] = 0;
      up.m_backend.data._M_elems[8] = 0;
      up.m_backend.data._M_elems[9] = 0;
      up.m_backend.data._M_elems[10] = 0;
      up.m_backend.data._M_elems[0xb] = 0;
      up.m_backend.data._M_elems[0xc] = 0;
      up.m_backend.data._M_elems[0xd] = 0;
      up.m_backend.data._M_elems[0xe] = 0;
      up.m_backend.data._M_elems[0xf] = 0;
      up.m_backend.data._M_elems[0x10] = 0;
      up.m_backend.data._M_elems[0x11] = 0;
      up.m_backend.data._M_elems[0x12] = 0;
      up.m_backend.data._M_elems[0x13] = 0;
      up.m_backend.data._M_elems[0x14] = 0;
      up.m_backend.data._M_elems[0x15] = 0;
      up.m_backend.data._M_elems[0x16] = 0;
      up.m_backend.data._M_elems[0x17] = 0;
      up.m_backend.data._M_elems[0x18] = 0;
      up.m_backend.data._M_elems[0x19] = 0;
      up.m_backend.data._M_elems._104_5_ = 0;
      up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&up.m_backend,&result_3.m_backend,&scale.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&val.m_backend,&scale.m_backend);
      z.m_backend.fpclass = cpp_dec_float_finite;
      z.m_backend.prec_elem = 0x1c;
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0;
      z.m_backend.data._M_elems[2] = 0;
      z.m_backend.data._M_elems[3] = 0;
      z.m_backend.data._M_elems[4] = 0;
      z.m_backend.data._M_elems[5] = 0;
      z.m_backend.data._M_elems[6] = 0;
      z.m_backend.data._M_elems[7] = 0;
      z.m_backend.data._M_elems[8] = 0;
      z.m_backend.data._M_elems[9] = 0;
      z.m_backend.data._M_elems[10] = 0;
      z.m_backend.data._M_elems[0xb] = 0;
      z.m_backend.data._M_elems[0xc] = 0;
      z.m_backend.data._M_elems[0xd] = 0;
      z.m_backend.data._M_elems[0xe] = 0;
      z.m_backend.data._M_elems[0xf] = 0;
      z.m_backend.data._M_elems[0x10] = 0;
      z.m_backend.data._M_elems[0x11] = 0;
      z.m_backend.data._M_elems[0x12] = 0;
      z.m_backend.data._M_elems[0x13] = 0;
      z.m_backend.data._M_elems[0x14] = 0;
      z.m_backend.data._M_elems[0x15] = 0;
      z.m_backend.data._M_elems[0x16] = 0;
      z.m_backend.data._M_elems[0x17] = 0;
      z.m_backend.data._M_elems[0x18] = 0;
      z.m_backend.data._M_elems[0x19] = 0;
      z.m_backend.data._M_elems._104_5_ = 0;
      z.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      z.m_backend.exp = 0;
      z.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&z.m_backend,&up.m_backend,&result_1.m_backend);
      pcVar11 = &z.m_backend;
      pnVar12 = &local_330;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar23 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = z.m_backend.exp;
      local_330.m_backend.neg = z.m_backend.neg;
      local_330.m_backend.fpclass = z.m_backend.fpclass;
      local_330.m_backend.prec_elem = z.m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_130,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_330,&local_130);
      if (bVar6) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&z,0.0);
      }
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 0x1c;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems[6] = 0;
      result_3.m_backend.data._M_elems[7] = 0;
      result_3.m_backend.data._M_elems[8] = 0;
      result_3.m_backend.data._M_elems[9] = 0;
      result_3.m_backend.data._M_elems[10] = 0;
      result_3.m_backend.data._M_elems[0xb] = 0;
      result_3.m_backend.data._M_elems[0xc] = 0;
      result_3.m_backend.data._M_elems[0xd] = 0;
      result_3.m_backend.data._M_elems[0xe] = 0;
      result_3.m_backend.data._M_elems[0xf] = 0;
      result_3.m_backend.data._M_elems[0x10] = 0;
      result_3.m_backend.data._M_elems[0x11] = 0;
      result_3.m_backend.data._M_elems[0x12] = 0;
      result_3.m_backend.data._M_elems[0x13] = 0;
      result_3.m_backend.data._M_elems[0x14] = 0;
      result_3.m_backend.data._M_elems[0x15] = 0;
      result_3.m_backend.data._M_elems[0x16] = 0;
      result_3.m_backend.data._M_elems[0x17] = 0;
      result_3.m_backend.data._M_elems[0x18] = 0;
      result_3.m_backend.data._M_elems[0x19] = 0;
      result_3.m_backend.data._M_elems._104_5_ = 0;
      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_3.m_backend.exp = 0;
      result_3.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_3.m_backend,&z.m_backend,&scale.m_backend);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_1.m_backend,pSVar18,this->m_j);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 0x1c;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems[6] = 0;
      up.m_backend.data._M_elems[7] = 0;
      up.m_backend.data._M_elems[8] = 0;
      up.m_backend.data._M_elems[9] = 0;
      up.m_backend.data._M_elems[10] = 0;
      up.m_backend.data._M_elems[0xb] = 0;
      up.m_backend.data._M_elems[0xc] = 0;
      up.m_backend.data._M_elems[0xd] = 0;
      up.m_backend.data._M_elems[0xe] = 0;
      up.m_backend.data._M_elems[0xf] = 0;
      up.m_backend.data._M_elems[0x10] = 0;
      up.m_backend.data._M_elems[0x11] = 0;
      up.m_backend.data._M_elems[0x12] = 0;
      up.m_backend.data._M_elems[0x13] = 0;
      up.m_backend.data._M_elems[0x14] = 0;
      up.m_backend.data._M_elems[0x15] = 0;
      up.m_backend.data._M_elems[0x16] = 0;
      up.m_backend.data._M_elems[0x17] = 0;
      up.m_backend.data._M_elems[0x18] = 0;
      up.m_backend.data._M_elems[0x19] = 0;
      up.m_backend.data._M_elems._104_5_ = 0;
      up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&up.m_backend,&result_3.m_backend,&result_1.m_backend);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&slack,uVar9,&val);
      tVar5 = boost::multiprecision::operator<(&up,&result_11);
      if (tVar5) {
        pnVar12 = &up;
        pnVar13 = &result_11;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
        }
        result_11.m_backend.exp = up.m_backend.exp;
        result_11.m_backend.neg = up.m_backend.neg;
        result_11.m_backend.fpclass = up.m_backend.fpclass;
        result_11.m_backend.prec_elem = up.m_backend.prec_elem;
        local_81c = uVar9;
      }
    }
    tVar5 = boost::multiprecision::operator<(&this->m_bnd,&result_11);
  }
  pcVar11 = &(x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
  if (tVar5 == false) {
    pnVar12 = &result_11;
    pcVar14 = pcVar11;
    for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
      (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar23 * -8 + 4);
    }
    pcVar11->exp = result_11.m_backend.exp;
    pcVar11->neg = result_11.m_backend.neg;
    pcVar11->fpclass = result_11.m_backend.fpclass;
    pcVar11->prec_elem = result_11.m_backend.prec_elem;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (pcVar11,&(this->m_bnd).m_backend);
    local_81c = 0xffffffff;
  }
  lVar10 = 0;
  for (lVar19 = 0;
      lVar19 < (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar19 = lVar19 + 1) {
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&val,&slack.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,(int)lVar19);
    scale.m_backend.fpclass = cpp_dec_float_finite;
    scale.m_backend.prec_elem = 0x1c;
    scale.m_backend.data._M_elems[0] = 0;
    scale.m_backend.data._M_elems[1] = 0;
    scale.m_backend.data._M_elems[2] = 0;
    scale.m_backend.data._M_elems[3] = 0;
    scale.m_backend.data._M_elems[4] = 0;
    scale.m_backend.data._M_elems[5] = 0;
    scale.m_backend.data._M_elems[6] = 0;
    scale.m_backend.data._M_elems[7] = 0;
    scale.m_backend.data._M_elems[8] = 0;
    scale.m_backend.data._M_elems[9] = 0;
    scale.m_backend.data._M_elems[10] = 0;
    scale.m_backend.data._M_elems[0xb] = 0;
    scale.m_backend.data._M_elems[0xc] = 0;
    scale.m_backend.data._M_elems[0xd] = 0;
    scale.m_backend.data._M_elems[0xe] = 0;
    scale.m_backend.data._M_elems[0xf] = 0;
    scale.m_backend.data._M_elems[0x10] = 0;
    scale.m_backend.data._M_elems[0x11] = 0;
    scale.m_backend.data._M_elems[0x12] = 0;
    scale.m_backend.data._M_elems[0x13] = 0;
    scale.m_backend.data._M_elems[0x14] = 0;
    scale.m_backend.data._M_elems[0x15] = 0;
    scale.m_backend.data._M_elems[0x16] = 0;
    scale.m_backend.data._M_elems[0x17] = 0;
    scale.m_backend.data._M_elems[0x18] = 0;
    scale.m_backend.data._M_elems[0x19] = 0;
    scale.m_backend.data._M_elems._104_5_ = 0;
    scale.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    scale.m_backend.exp = 0;
    scale.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&scale.m_backend,
               (cpp_dec_float<200U,_int,_void> *)
               ((long)(((this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem)->val).m_backend.data._M_elems + lVar10),
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
    result_11.m_backend.fpclass = cpp_dec_float_finite;
    result_11.m_backend.prec_elem = 0x1c;
    result_11.m_backend.data._M_elems[0] = 0;
    result_11.m_backend.data._M_elems[1] = 0;
    result_11.m_backend.data._M_elems[2] = 0;
    result_11.m_backend.data._M_elems[3] = 0;
    result_11.m_backend.data._M_elems[4] = 0;
    result_11.m_backend.data._M_elems[5] = 0;
    result_11.m_backend.data._M_elems[6] = 0;
    result_11.m_backend.data._M_elems[7] = 0;
    result_11.m_backend.data._M_elems[8] = 0;
    result_11.m_backend.data._M_elems[9] = 0;
    result_11.m_backend.data._M_elems[10] = 0;
    result_11.m_backend.data._M_elems[0xb] = 0;
    result_11.m_backend.data._M_elems[0xc] = 0;
    result_11.m_backend.data._M_elems[0xd] = 0;
    result_11.m_backend.data._M_elems[0xe] = 0;
    result_11.m_backend.data._M_elems[0xf] = 0;
    result_11.m_backend.data._M_elems[0x10] = 0;
    result_11.m_backend.data._M_elems[0x11] = 0;
    result_11.m_backend.data._M_elems[0x12] = 0;
    result_11.m_backend.data._M_elems[0x13] = 0;
    result_11.m_backend.data._M_elems[0x14] = 0;
    result_11.m_backend.data._M_elems[0x15] = 0;
    result_11.m_backend.data._M_elems[0x16] = 0;
    result_11.m_backend.data._M_elems[0x17] = 0;
    result_11.m_backend.data._M_elems[0x18] = 0;
    result_11.m_backend.data._M_elems[0x19] = 0;
    result_11.m_backend.data._M_elems._104_5_ = 0;
    result_11.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_11.m_backend.exp = 0;
    result_11.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_11.m_backend,&val.m_backend,&scale.m_backend);
    iVar2 = *(int *)((long)(&((this->m_col).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem)->val + 1) + lVar10);
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar11 = &result_11.m_backend;
    pnVar15 = pnVar3 + iVar2;
    for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar23 * -8 + 4);
      pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    pnVar3[iVar2].m_backend.exp = result_11.m_backend.exp;
    pnVar3[iVar2].m_backend.neg = result_11.m_backend.neg;
    pnVar3[iVar2].m_backend.fpclass = result_11.m_backend.fpclass;
    pnVar3[iVar2].m_backend.prec_elem = result_11.m_backend.prec_elem;
    lVar10 = lVar10 + 0x84;
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  lVar10 = 0x80;
  for (lVar19 = 0;
      uVar8 = (ulong)(this->m_col).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, lVar19 < (long)uVar8; lVar19 = lVar19 + 1) {
    iVar2 = *(int *)((long)(((this->m_col).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar10);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&result_11,
                 &(this->m_rowObj).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,iVar2);
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar12 = &result_11;
    pnVar15 = pnVar3 + iVar2;
    for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    pnVar3[iVar2].m_backend.exp = result_11.m_backend.exp;
    pnVar3[iVar2].m_backend.neg = result_11.m_backend.neg;
    pnVar3[iVar2].m_backend.fpclass = result_11.m_backend.fpclass;
    pnVar3[iVar2].m_backend.prec_elem = result_11.m_backend.prec_elem;
    lVar10 = lVar10 + 0x84;
  }
  uVar22 = (ulong)local_81c;
  lVar19 = 0x80;
  for (uVar20 = 0; (long)uVar20 < (long)(int)uVar8; uVar20 = uVar20 + 1) {
    if (uVar22 == uVar20) {
      cStatus->data[this->m_j] = BASIC;
      pNVar16 = (this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem + uVar22;
      if (this->m_loFree == true) {
        result_11.m_backend.data._M_elems._0_8_ =
             (ulong)result_11.m_backend.data._M_elems[1] << 0x20;
        tVar5 = boost::multiprecision::operator>(&pNVar16->val,(int *)&result_11);
        bVar6 = !tVar5;
      }
      else {
        result_11.m_backend.data._M_elems._0_8_ =
             (ulong)result_11.m_backend.data._M_elems[1] << 0x20;
        bVar6 = boost::multiprecision::operator>(&pNVar16->val,(int *)&result_11);
      }
      rStatus->data
      [(this->m_col).
       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .m_elem[uVar22].idx] = (uint)bVar6;
    }
    else {
      rStatus->data
      [*(int *)((long)(((this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem)->val).m_backend.data._M_elems + lVar19)] = BASIC;
    }
    uVar8 = (ulong)(uint)(this->m_col).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
    lVar19 = lVar19 + 0x84;
  }
  if (local_81c == 0xffffffff) {
    cStatus->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~DSVectorBase(&slack);
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}